

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
vkt::shaderexecutor::FloatFunc2::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc2 *this,EvalContext *ctx,Interval *xi,
          Interval *yi)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  char cVar5;
  deRoundingMode dVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ulong uVar14;
  double dVar15;
  Interval reti;
  uint local_120 [2];
  double local_118;
  double local_110;
  double local_108;
  ulong uStack_100;
  double local_f8;
  ulong uStack_f0;
  Interval local_e8;
  Interval *local_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_e8.m_hasNaN = false;
  local_e8.m_lo = INFINITY;
  local_e8.m_hi = -INFINITY;
  dVar11 = xi->m_lo;
  if (dVar11 < xi->m_hi || dVar11 == xi->m_hi) {
    dVar12 = yi->m_lo;
    local_d0 = __return_storage_ptr__;
    if (dVar12 < yi->m_hi || dVar12 == yi->m_hi) {
      local_108 = dVar12;
      local_f8 = dVar11;
      dVar6 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      bVar1 = (byte)local_120[0];
      local_78 = local_118;
      uStack_70 = 0;
      local_68 = local_110;
      uStack_60 = 0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      bVar2 = (byte)local_120[0];
      local_98 = local_118;
      uStack_90 = 0;
      local_88 = local_110;
      uStack_80 = 0;
      deSetRoundingMode(dVar6);
      local_108 = yi->m_hi;
      dVar6 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      uVar3 = (byte)local_120[0];
      local_a8 = local_118;
      uStack_a0 = 0;
      local_b8 = local_110;
      uStack_b0 = 0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      local_c8 = (double)CONCAT71(local_c8._1_7_,uVar3);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      uVar7 = local_120[0];
      local_f8 = local_118;
      uStack_f0 = 0;
      local_108 = local_110;
      uStack_100 = 0;
      deSetRoundingMode(dVar6);
      dVar11 = (double)(~-(ulong)(local_78 <= local_98) & (ulong)local_98 |
                       (ulong)local_78 & -(ulong)(local_78 <= local_98));
      uVar10 = ~uStack_70 & uStack_90 | uStack_70;
      dVar12 = (double)(~-(ulong)(local_88 <= local_68) & (ulong)local_88 |
                       (ulong)local_68 & -(ulong)(local_88 <= local_68));
      dVar13 = (double)(~-(ulong)(local_108 <= local_b8) & (ulong)local_108 |
                       (ulong)local_b8 & -(ulong)(local_108 <= local_b8));
      uVar7 = uVar7 & 0xff;
      if (((ulong)local_c8 & 1) != 0) {
        uVar7 = 1;
      }
      dVar15 = (double)(~-(ulong)(local_a8 <= local_f8) & (ulong)local_f8 |
                       (ulong)local_a8 & -(ulong)(local_a8 <= local_f8));
      if (((bVar1 | bVar2) & 1) != 0) {
        uVar7 = 1;
      }
      uVar9 = -(ulong)(dVar11 <= dVar15);
      dVar11 = (double)(uVar9 & (ulong)dVar11 | ~uVar9 & (ulong)dVar15);
      uVar10 = uVar10 | ~uVar10 & (~uStack_a0 & uStack_f0 | uStack_a0);
      uVar9 = -(ulong)(dVar13 <= dVar12);
      uVar14 = uStack_b0 & uStack_100 & uStack_60 & uStack_80;
      dVar12 = (double)(uVar9 & (ulong)dVar12 | ~uVar9 & (ulong)dVar13);
    }
    else {
      dVar12 = -INFINITY;
      uVar14 = 0;
      dVar11 = INFINITY;
      uVar10 = 0;
      uVar7 = 0;
    }
    if (yi->m_hasNaN == true) {
      if (INFINITY <= dVar11) {
        dVar11 = INFINITY;
      }
      if (dVar12 <= -INFINITY) {
        dVar12 = -INFINITY;
      }
      uVar7 = 1;
    }
    dVar13 = yi->m_lo;
    if (dVar13 < yi->m_hi || dVar13 == yi->m_hi) {
      local_f8 = xi->m_hi;
      local_108 = dVar13;
      local_78 = dVar11;
      uStack_70 = uVar10;
      local_68 = dVar12;
      uStack_60 = uVar14;
      dVar6 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      bVar1 = (byte)local_120[0];
      local_98 = local_118;
      uStack_90 = 0;
      local_88 = local_110;
      uStack_80 = 0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      local_a8 = (double)CONCAT71(local_a8._1_7_,(byte)local_120[0]);
      local_c8 = local_118;
      uStack_c0 = 0;
      local_b8 = local_110;
      uStack_b0 = 0;
      deSetRoundingMode(dVar6);
      local_108 = yi->m_hi;
      dVar6 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      uVar4 = local_120[0];
      local_48 = local_118;
      uStack_40 = 0;
      local_58 = local_110;
      uStack_50 = 0;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_f8,local_108,local_120,this,ctx);
      cVar5 = (byte)local_120[0];
      local_f8 = local_118;
      uStack_f0 = 0;
      local_108 = local_110;
      uStack_100 = 0;
      deSetRoundingMode(dVar6);
      dVar11 = (double)(~-(ulong)(local_98 <= local_c8) & (ulong)local_c8 |
                       (ulong)local_98 & -(ulong)(local_98 <= local_c8));
      dVar12 = (double)(~-(ulong)(local_b8 <= local_88) & (ulong)local_b8 |
                       (ulong)local_88 & -(ulong)(local_b8 <= local_88));
      dVar13 = (double)(~-(ulong)(local_108 <= local_58) & (ulong)local_108 |
                       (ulong)local_58 & -(ulong)(local_108 <= local_58));
      if ((uVar4 & 1) != 0) {
        cVar5 = '\x01';
      }
      dVar15 = (double)(~-(ulong)(local_48 <= local_f8) & (ulong)local_f8 |
                       (ulong)local_48 & -(ulong)(local_48 <= local_f8));
      if (((bVar1 | local_a8._0_1_) & 1) != 0) {
        cVar5 = '\x01';
      }
      uVar10 = -(ulong)(dVar11 <= dVar15);
      dVar15 = (double)(uVar10 & (ulong)dVar11 | ~uVar10 & (ulong)dVar15);
      uVar10 = -(ulong)(dVar13 <= dVar12);
      dVar13 = (double)(uVar10 & (ulong)dVar12 | ~uVar10 & (ulong)dVar13);
      dVar11 = local_78;
      dVar12 = local_68;
    }
    else {
      dVar13 = -INFINITY;
      dVar15 = INFINITY;
      cVar5 = '\0';
    }
    if (yi->m_hasNaN == true) {
      if (INFINITY <= dVar15) {
        dVar15 = INFINITY;
      }
      if (dVar13 <= -INFINITY) {
        dVar13 = -INFINITY;
      }
      cVar5 = '\x01';
    }
    local_e8.m_hasNaN = (bool)'\x01';
    if ((uVar7 & 1) == 0) {
      local_e8.m_hasNaN = (bool)cVar5;
    }
    local_e8.m_lo =
         (double)(~-(ulong)(dVar11 <= dVar15) & (ulong)dVar15 |
                 (ulong)dVar11 & -(ulong)(dVar11 <= dVar15));
    local_e8.m_hi =
         (double)(~-(ulong)(dVar13 <= dVar12) & (ulong)dVar13 |
                 (ulong)dVar12 & -(ulong)(dVar13 <= dVar12));
    __return_storage_ptr__ = local_d0;
  }
  else {
    local_e8.m_hi = -INFINITY;
    local_e8.m_lo = INFINITY;
    local_e8.m_hasNaN = false;
  }
  if (xi->m_hasNaN == true) {
    if (INFINITY <= local_e8.m_lo) {
      local_e8.m_lo = INFINITY;
    }
    if (local_e8.m_hi <= -INFINITY) {
      local_e8.m_hi = -INFINITY;
    }
    local_e8.m_hasNaN = true;
  }
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(local_120,this,ctx,xi,yi);
  bVar8 = local_e8.m_hasNaN == false;
  local_e8.m_hasNaN = true;
  if (bVar8) {
    local_e8.m_hasNaN = (bool)(byte)local_120[0];
  }
  local_e8.m_lo =
       (double)(~-(ulong)(local_e8.m_lo <= local_118) & (ulong)local_118 |
               (ulong)local_e8.m_lo & -(ulong)(local_e8.m_lo <= local_118));
  local_e8.m_hi =
       (double)(~-(ulong)(local_110 <= local_e8.m_hi) & (ulong)local_110 |
               (ulong)local_e8.m_hi & -(ulong)(local_110 <= local_e8.m_hi));
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(local_120,this);
  if (INFINITY <= local_118) {
    local_118 = INFINITY;
  }
  if (local_110 <= -INFINITY) {
    local_110 = -INFINITY;
  }
  local_e8.m_lo =
       (double)(~-(ulong)(local_118 <= local_e8.m_lo) & (ulong)local_118 |
               (ulong)local_e8.m_lo & -(ulong)(local_118 <= local_e8.m_lo));
  local_e8.m_hi =
       (double)(~-(ulong)(local_e8.m_hi <= local_110) & (ulong)local_110 |
               (ulong)local_e8.m_hi & -(ulong)(local_e8.m_hi <= local_110));
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi) const
	{
		Interval reti;

		TCU_INTERVAL_APPLY_MONOTONE2(reti, x, xi, y, yi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y)));
		reti |= innerExtrema(ctx, xi, yi);
		reti &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(reti);
	}